

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

ImageFormat __thiscall
deqp::gls::fboc::details::TestBase::getDefaultFormat(TestBase *this,GLenum attPoint,GLenum bufType)

{
  bool bVar1;
  FormatFlags FVar2;
  FormatFlags FVar3;
  FormatDB *pFVar4;
  NotSupportedError *this_00;
  reference pIVar5;
  _Self local_b0;
  _Base_ptr local_a8;
  Formats local_90;
  _Self local_60;
  _Self local_58;
  const_iterator it;
  Formats formats;
  GLenum bufType_local;
  GLenum attPoint_local;
  TestBase *this_local;
  
  if (bufType == 0) {
    this_local = (TestBase *)FboUtil::ImageFormat::none();
  }
  else {
    pFVar4 = Context::getCoreFormats(this->m_ctx);
    FVar2 = FboUtil::formatFlag(attPoint);
    FVar3 = FboUtil::formatFlag(bufType);
    FVar2 = FboUtil::operator|(FVar2,FVar3);
    FboUtil::FormatDB::getFormats((Formats *)&it,pFVar4,FVar2);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)&it);
    local_60._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                *)&it);
    bVar1 = std::operator==(&local_58,&local_60);
    if (bVar1) {
      pFVar4 = Context::getCtxFormats(this->m_ctx);
      FVar2 = FboUtil::formatFlag(attPoint);
      FVar3 = FboUtil::formatFlag(bufType);
      FVar2 = FboUtil::operator|(FVar2,FVar3);
      FboUtil::FormatDB::getFormats(&local_90,pFVar4,FVar2);
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::operator=((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                   *)&it,&local_90);
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~set(&local_90);
      local_a8 = (_Base_ptr)
                 std::
                 set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                 ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                          *)&it);
      local_58._M_node = local_a8;
    }
    local_b0._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                *)&it);
    bVar1 = std::operator==(&local_58,&local_b0);
    if (bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Unsupported attachment kind for attachment point","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                 ,0x2bf);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    pIVar5 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_58);
    this_local = *(TestBase **)pIVar5;
    std::
    set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
    ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
            *)&it);
  }
  return (ImageFormat)this_local;
}

Assistant:

ImageFormat TestBase::getDefaultFormat (GLenum attPoint, GLenum bufType) const
{
	if (bufType == GL_NONE)
	{
		return ImageFormat::none();
	}

	// Prefer a standard format, if there is one, but if not, use a format
	// provided by an extension.
	Formats formats = m_ctx.getCoreFormats().getFormats(formatFlag(attPoint) |
														 formatFlag(bufType));
	Formats::const_iterator it = formats.begin();
	if (it == formats.end())
	{
		formats = m_ctx.getCtxFormats().getFormats(formatFlag(attPoint) |
													 formatFlag(bufType));
		it = formats.begin();
	}
	if (it == formats.end())
		throw tcu::NotSupportedError("Unsupported attachment kind for attachment point",
									 "", __FILE__, __LINE__);
	return *it;
}